

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

value_type * __thiscall
toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::at
          (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *this,key *k)

{
  size_type sVar1;
  mapped_type *pmVar2;
  allocator<char> local_31;
  string local_30;
  
  if (this->type_ != table) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"toml::value::at(key): ",&local_31);
    detail::
    throw_bad_cast<(toml::value_t)10,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
              (&local_30,this->type_,this);
  }
  sVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(this->field_1).integer_,k);
  if (sVar1 != 0) {
    pmVar2 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)(this->field_1).integer_,k);
    return pmVar2;
  }
  detail::
  throw_key_not_found_error<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
            (this,k);
}

Assistant:

value_type const& at(const key& k) const
    {
        if(!this->is_table())
        {
            detail::throw_bad_cast<value_t::table>(
                "toml::value::at(key): ", this->type_, *this);
        }
        if(this->as_table(std::nothrow).count(k) == 0)
        {
            detail::throw_key_not_found_error(*this, k);
        }
        return this->as_table(std::nothrow).at(k);
    }